

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1636:15)>
::getImpl(TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1636:15)>
          *this,ExceptionOrValue *output)

{
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *other;
  Maybe<kj::Exception> *pMVar1;
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::_::Void> local_358;
  ExceptionOrValue local_1b8;
  char local_20;
  
  local_1b8.exception.ptr.isSet = false;
  local_20 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1b8);
  other = &local_1b8.exception.ptr.field_1;
  if (local_1b8.exception.ptr.isSet == true) {
    pMVar1 = (this->errorHandler).maybeException;
    if ((pMVar1->ptr).isSet == true) {
      (pMVar1->ptr).isSet = false;
      Exception::~Exception(&(pMVar1->ptr).field_1.value);
    }
    Exception::Exception(&(pMVar1->ptr).field_1.value,&other->value);
    (pMVar1->ptr).isSet = true;
    local_358.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_358.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_358);
  }
  else {
    if (local_20 != '\x01') goto LAB_00217f6c;
    local_358.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_358.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_358);
  }
  if (local_358.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_358.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00217f6c:
  if (local_1b8.exception.ptr.isSet == true) {
    Exception::~Exception(&other->value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }